

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManCycle(Gia_Man_t *p,Abc_Cex_t *pCex,int nFrames)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  int iVar7;
  
  Gia_ManRandom(1);
  if ((pCex != (Abc_Cex_t *)0x0) && (pCex->iFrame < nFrames)) {
    __assert_fail("pCex == NULL || nFrames <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x287,"void Gia_ManCycle(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  iVar2 = 0;
  if (nFrames < 1) {
    nFrames = iVar2;
  }
  for (; iVar2 != nFrames; iVar2 = iVar2 + 1) {
    iVar7 = 0;
    while ((iVar7 < p->vCis->nSize - p->nRegs &&
           (pGVar4 = Gia_ManCi(p,iVar7), pGVar4 != (Gia_Obj_t *)0x0))) {
      if (pCex == (Abc_Cex_t *)0x0) {
        uVar3 = Gia_ManRandom(0);
      }
      else {
        iVar6 = pCex->nPis * iVar2 + pCex->nRegs + iVar7;
        uVar3 = (uint)(&pCex[1].iPo)[iVar6 >> 5] >> ((byte)iVar6 & 0x1f);
      }
      *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xffffffffbfffffff | (ulong)((uVar3 & 1) << 0x1e);
      iVar7 = iVar7 + 1;
    }
    iVar7 = 0;
    while ((iVar7 < p->nObjs && (pGVar4 = Gia_ManObj(p,iVar7), pGVar4 != (Gia_Obj_t *)0x0))) {
      uVar1 = *(ulong *)pGVar4;
      if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
        uVar3 = (uint)(uVar1 >> 0x20);
        *(ulong *)pGVar4 =
             uVar1 & 0xffffffff3fffffff |
             (ulong)(((uVar3 >> 0x1d ^ *(uint *)(pGVar4 + -(ulong)(uVar3 & 0x1fffffff)) >> 0x1e) &
                      ((uint)(uVar1 >> 0x1d) & 7 ^ *(uint *)(pGVar4 + -(uVar1 & 0x1fffffff)) >> 0x1e
                      ) & 1) << 0x1e);
      }
      iVar7 = iVar7 + 1;
    }
    iVar7 = 0;
    while ((iVar7 < p->vCos->nSize && (pGVar4 = Gia_ManCo(p,iVar7), pGVar4 != (Gia_Obj_t *)0x0))) {
      uVar3 = (uint)*(ulong *)pGVar4;
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xffffffffbfffffff |
           (ulong)((uVar3 * 2 ^ *(uint *)(pGVar4 + -(ulong)(uVar3 & 0x1fffffff))) & 0x40000000);
      iVar7 = iVar7 + 1;
    }
    iVar7 = 0;
    while (((iVar7 < p->nRegs &&
            (pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar7), pGVar4 != (Gia_Obj_t *)0x0))
           && (pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar7), pGVar5 != (Gia_Obj_t *)0x0
              ))) {
      *(ulong *)pGVar5 =
           *(ulong *)pGVar5 & 0xffffffffbfffffff | (ulong)((uint)*(undefined8 *)pGVar4 & 0x40000000)
      ;
      iVar7 = iVar7 + 1;
    }
  }
  return;
}

Assistant:

void Gia_ManCycle( Gia_Man_t * p, Abc_Cex_t * pCex, int nFrames )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, k;
    Gia_ManRandom( 1 );
    assert( pCex == NULL || nFrames <= pCex->iFrame );
    // iterate for the given number of frames
    for ( i = 0; i < nFrames; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = pCex ? Abc_InfoHasBit(pCex->pData, pCex->nRegs+i*pCex->nPis+k) : (1 & Gia_ManRandom(0));
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
}